

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

_Bool upb_strtable_next2(upb_strtable *t,upb_StringView *key,upb_value *val,intptr_t *iter)

{
  byte bVar1;
  uint uVar2;
  upb_tabent *puVar3;
  uint *puVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  char *mem;
  
  bVar1 = (t->t).size_lg2;
  if (bVar1 != 0) {
    uVar7 = *iter;
    lVar6 = uVar7 * 0x18;
    while (lVar5 = lVar6, uVar7 = uVar7 + 1, uVar7 < (ulong)(long)(1 << (bVar1 & 0x1f))) {
      puVar3 = (t->t).entries;
      puVar4 = *(uint **)((long)&puVar3[1].key + lVar5);
      lVar6 = lVar5 + 0x18;
      if (puVar4 != (uint *)0x0) {
        uVar2 = *puVar4;
        key->data = (char *)(puVar4 + 1);
        key->size = (ulong)uVar2;
        val->val = *(uint64_t *)((long)&puVar3[1].val.val + lVar5);
        *iter = uVar7;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool upb_strtable_next2(const upb_strtable* t, upb_StringView* key,
                        upb_value* val, intptr_t* iter) {
  size_t tab_idx = next(&t->t, *iter);
  if (tab_idx < upb_table_size(&t->t)) {
    upb_tabent* ent = &t->t.entries[tab_idx];
    uint32_t len;
    key->data = upb_tabstr(ent->key, &len);
    key->size = len;
    *val = _upb_value_val(ent->val.val);
    *iter = tab_idx;
    return true;
  }

  return false;
}